

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O3

cmDependInformation * __thiscall
anon_unknown.dwarf_12ce966::cmLBDepend::GetDependInformation
          (cmLBDepend *this,string *file,string *extraPath)

{
  _Base_ptr *__k;
  DirectoryToFileToPathMapType *this_00;
  _Rb_tree_header *__x;
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  pointer pcVar4;
  default_delete<(anonymous_namespace)::cmDependInformation> *this_01;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  _Rb_tree_header *p_Var8;
  cmLBDepend *pcVar9;
  bool bVar10;
  int iVar11;
  byte extraout_var;
  iterator iVar12;
  iterator iVar13;
  mapped_type *pmVar14;
  mapped_type *pmVar15;
  iterator iVar16;
  cmDependInformation *__s;
  cmDependInformation *this_02;
  _Rb_tree_node_base *p_Var17;
  ulong uVar18;
  _Alloc_hider in_RCX;
  _Base_ptr p_Var19;
  pointer pbVar20;
  cmDependInformation *__ptr;
  DependInformationMapType *this_03;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar21;
  string path;
  string fullPath;
  string local_a0;
  cmLBDepend *local_80;
  _Alloc_hider local_78;
  _Base_ptr local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  DependInformationMapType *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->DirectoryToFileToPathMap;
  iVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::find(&this_00->_M_t,extraPath);
  local_80 = this;
  if (((_Rb_tree_header *)iVar12._M_node ==
       &(this->DirectoryToFileToPathMap)._M_t._M_impl.super__Rb_tree_header) ||
     (iVar13 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(iVar12._M_node + 2,file),
     iVar13._M_node == (_Base_ptr)&iVar12._M_node[2]._M_parent)) {
    bVar10 = cmsys::SystemTools::FileExists(file,true);
    if (bVar10) {
      cmsys::SystemTools::CollapseFullPath((string *)&local_78,file);
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                ::operator[](this_00,extraPath);
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](pmVar14,file);
      std::__cxx11::string::_M_assign((string *)pmVar15);
    }
    else {
      pbVar20 = (this->IncludeDirectories).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (this->IncludeDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar20 != pbVar3) {
        paVar2 = &local_a0.field_2;
        do {
          pcVar4 = (pbVar20->_M_dataplus)._M_p;
          local_a0._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,pcVar4,pcVar4 + pbVar20->_M_string_length);
          if ((local_a0._M_string_length != 0) &&
             (in_RCX._M_p = local_a0._M_dataplus._M_p,
             local_a0._M_dataplus._M_p[local_a0._M_string_length - 1] != '/')) {
            std::__cxx11::string::append((char *)&local_a0);
          }
          std::__cxx11::string::_M_append((char *)&local_a0,(ulong)(file->_M_dataplus)._M_p);
          bVar10 = cmsys::SystemTools::FileExists(&local_a0,true);
          if (bVar10) {
            cmsys::SystemTools::CollapseFullPath((string *)&local_78,&local_a0);
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      ::operator[](this_00,extraPath);
            this = local_80;
            pmVar15 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](pmVar14,file);
            std::__cxx11::string::_M_assign((string *)pmVar15);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != paVar2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            goto LAB_003ab831;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          pbVar20 = pbVar20 + 1;
        } while (pbVar20 != pbVar3);
      }
      if (extraPath->_M_string_length != 0) {
        paVar2 = &local_a0.field_2;
        pcVar4 = (extraPath->_M_dataplus)._M_p;
        local_a0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar4,pcVar4 + extraPath->_M_string_length);
        if ((local_a0._M_string_length != 0) &&
           (local_a0._M_dataplus._M_p[local_a0._M_string_length - 1] != '/')) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_a0._M_dataplus._M_p,
                     local_a0._M_dataplus._M_p + local_a0._M_string_length);
          std::__cxx11::string::append((char *)&local_50);
          std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        std::operator+(&local_50,&local_a0,file);
        std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar10 = cmsys::SystemTools::FileExists(&local_a0,true);
        if (bVar10) {
          cmsys::SystemTools::CollapseFullPath((string *)&local_78,&local_a0);
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    ::operator[](this_00,extraPath);
          pmVar15 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](pmVar14,file);
          std::__cxx11::string::_M_assign((string *)pmVar15);
          this = local_80;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            this = local_80;
          }
          goto LAB_003ab831;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      local_78._M_p = (pointer)&local_68;
      pcVar4 = (file->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar4,pcVar4 + file->_M_string_length);
      this = local_80;
    }
  }
  else {
    in_RCX._M_p = (pointer)&local_68;
    local_78._M_p = in_RCX._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,*(long *)(iVar13._M_node + 2),
               (long)&(iVar13._M_node[2]._M_parent)->_M_color + *(long *)(iVar13._M_node + 2));
  }
LAB_003ab831:
  __x = &(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header;
  iVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
           ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                             *)(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_parent,(_Link_type)__x,(_Base_ptr)&local_78,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RCX._M_p);
  if (((_Rb_tree_header *)iVar16._M_node != __x) &&
     (iVar11 = std::__cxx11::string::compare((string *)&local_78), -1 < iVar11)) {
    __s = *(cmDependInformation **)(iVar16._M_node + 2);
    goto LAB_003abad3;
  }
  __s = (cmDependInformation *)operator_new(0xa0);
  p_Var8 = &(__s->DependencySet)._M_t._M_impl.super__Rb_tree_header;
  memset(__s,0,0xa0);
  *(_Rb_tree_header **)((long)&(__s->DependencySet)._M_t._M_impl.super__Rb_tree_header + 0x10) =
       p_Var8;
  *(_Rb_tree_header **)((long)&(__s->DependencySet)._M_t._M_impl.super__Rb_tree_header + 0x18) =
       p_Var8;
  (__s->FullPath)._M_dataplus._M_p = (pointer)&(__s->FullPath).field_2;
  (__s->PathOnly)._M_dataplus._M_p = (pointer)&(__s->PathOnly).field_2;
  (__s->IncludeName)._M_dataplus._M_p = (pointer)&(__s->IncludeName).field_2;
  std::__cxx11::string::_M_assign((string *)&__s->FullPath);
  cmsys::SystemTools::GetFilenamePath(&local_a0,(string *)&local_78);
  std::__cxx11::string::operator=((string *)&__s->PathOnly,(string *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)&__s->IncludeName);
  pcVar9 = local_80;
  iVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
           ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                             *)*(_Base_ptr *)
                                ((long)&(local_80->DependInformationMap)._M_t._M_impl.
                                        super__Rb_tree_header._M_header + 8),(_Link_type)__x,
                            (_Base_ptr)&local_78,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RCX._M_p);
  if ((_Rb_tree_header *)iVar16._M_node == __x) {
LAB_003ab947:
    this_02 = (cmDependInformation *)operator_new(0x48);
    __k = &(this_02->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (this_02->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)&this_02->DependDone;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__k,local_78._M_p,(long)&local_70->_M_color + local_78._M_p);
    this_03 = &pcVar9->DependInformationMap;
    (this_02->FullPath)._M_dataplus._M_p = (pointer)0x0;
    if ((_Rb_tree_header *)iVar16._M_node == __x) {
      if (((pcVar9->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
         (__ptr = (cmDependInformation *)__k,
         iVar11 = std::__cxx11::string::compare
                            ((string *)
                             (*(_Base_ptr *)
                               ((long)&(pcVar9->DependInformationMap)._M_t._M_impl.
                                       super__Rb_tree_header._M_header + 0x18) + 1)), -1 < iVar11))
      {
LAB_003aba5d:
        __ptr = (cmDependInformation *)__k;
        pVar21 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                 ::_M_get_insert_unique_pos(&this_03->_M_t,(key_type *)__k);
      }
      else {
        p_Var19 = *(_Base_ptr *)
                   ((long)&(pcVar9->DependInformationMap)._M_t._M_impl.super__Rb_tree_header.
                           _M_header + 0x18);
LAB_003aba24:
        auVar6._8_8_ = 0;
        auVar6._0_8_ = p_Var19;
        pVar21 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar6 << 0x40);
      }
LAB_003aba69:
      iVar16._M_node = pVar21.first;
      if (pVar21.second == (_Rb_tree_node_base *)0x0) {
LAB_003aba97:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
        ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                        *)this_02,(_Link_type)__ptr);
        goto LAB_003abac1;
      }
    }
    else {
      __ptr = (cmDependInformation *)(iVar16._M_node + 1);
      local_58 = this_03;
      iVar11 = std::__cxx11::string::compare((string *)__k);
      if (-1 < iVar11) {
        __ptr = (cmDependInformation *)__k;
        iVar11 = std::__cxx11::string::compare((string *)(iVar16._M_node + 1));
        if (iVar11 < 0) {
          p_Var19 = *(_Base_ptr *)
                     ((long)&(pcVar9->DependInformationMap)._M_t._M_impl.super__Rb_tree_header.
                             _M_header + 0x18);
          if (p_Var19 == iVar16._M_node) goto LAB_003aba24;
          p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(iVar16._M_node);
          pVar21.second = p_Var17;
          pVar21.first = p_Var17;
          __ptr = (cmDependInformation *)(p_Var17 + 1);
          iVar11 = std::__cxx11::string::compare((string *)__k);
          this_03 = local_58;
          if (-1 < iVar11) goto LAB_003aba5d;
          if ((iVar16._M_node)->_M_right == (_Base_ptr)0x0) {
            auVar5._8_8_ = 0;
            auVar5._0_8_ = iVar16._M_node;
            pVar21 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar5 << 0x40);
            goto LAB_003aba74;
          }
          goto LAB_003aba69;
        }
        goto LAB_003aba97;
      }
      p_Var19 = *(_Base_ptr *)
                 ((long)&(pcVar9->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header
                 + 0x10);
      pVar21.second = p_Var19;
      pVar21.first = p_Var19;
      if (p_Var19 == iVar16._M_node) goto LAB_003aba69;
      uVar18 = std::_Rb_tree_decrement(iVar16._M_node);
      __ptr = (cmDependInformation *)__k;
      iVar11 = std::__cxx11::string::compare((string *)(uVar18 + 0x20));
      this_03 = local_58;
      if (-1 < iVar11) goto LAB_003aba5d;
      pVar21.second = iVar16._M_node;
      pVar21.first = iVar16._M_node;
      if (*(long *)(uVar18 + 0x18) != 0) goto LAB_003aba69;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar18;
      pVar21 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar7 << 0x40);
    }
LAB_003aba74:
    pcVar9 = local_80;
    bVar10 = true;
    if ((__x != (_Rb_tree_header *)pVar21.second) && (pVar21.first == (_Rb_tree_node_base *)0x0)) {
      std::__cxx11::string::compare((string *)__k);
      bVar10 = (bool)(extraout_var >> 7);
    }
    __ptr = this_02;
    std::_Rb_tree_insert_and_rebalance
              (bVar10,(_Rb_tree_node_base *)this_02,pVar21.second,&__x->_M_header);
    psVar1 = &(pcVar9->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar1 = *psVar1 + 1;
    iVar16._M_node = (_Base_ptr)this_02;
  }
  else {
    __ptr = (cmDependInformation *)(iVar16._M_node + 1);
    iVar11 = std::__cxx11::string::compare((string *)&local_78);
    if (iVar11 < 0) goto LAB_003ab947;
  }
LAB_003abac1:
  this_01 = (default_delete<(anonymous_namespace)::cmDependInformation> *)
            (((cmDependInformation *)iVar16._M_node)->FullPath)._M_dataplus._M_p;
  (((cmDependInformation *)iVar16._M_node)->FullPath)._M_dataplus._M_p = (pointer)__s;
  if (this_01 != (default_delete<(anonymous_namespace)::cmDependInformation> *)0x0) {
    std::default_delete<(anonymous_namespace)::cmDependInformation>::operator()(this_01,__ptr);
  }
LAB_003abad3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  return __s;
}

Assistant:

cmDependInformation* GetDependInformation(const std::string& file,
                                            const std::string& extraPath)
  {
    // Get the full path for the file so that lookup is unambiguous.
    std::string fullPath = this->FullPath(file, extraPath);

    // Try to find the file's instance of cmDependInformation.
    auto result = this->DependInformationMap.find(fullPath);
    if (result != this->DependInformationMap.end()) {
      // Found an instance, return it.
      return result->second.get();
    }
    // Didn't find an instance.  Create a new one and save it.
    auto info = cm::make_unique<cmDependInformation>();
    auto* ptr = info.get();
    info->FullPath = fullPath;
    info->PathOnly = cmSystemTools::GetFilenamePath(fullPath);
    info->IncludeName = file;
    this->DependInformationMap[fullPath] = std::move(info);
    return ptr;
  }